

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UnicodeString *stringToAdopt)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003d38e8;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e4bf0;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  init(this,(EVP_PKEY_CTX *)stringToAdopt);
  this->fType = kString;
  (this->fValue).fString = stringToAdopt;
  return;
}

Assistant:

Formattable::Formattable(UnicodeString* stringToAdopt)
{
    init();
    fType = kString;
    fValue.fString = stringToAdopt;
}